

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_simplices_iterators.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
::Simplex_iterator(Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                   *this,Complex *complex)

{
  Complex *pCVar1;
  bool bVar2;
  reference rVar3;
  Complex_vertex_iterator *__return_storage_ptr__;
  iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  local_48;
  Complex *local_18;
  Complex *complex_local;
  Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  *this_local;
  
  this->complex_ = complex;
  __return_storage_ptr__ = &this->current_vertex_;
  local_18 = complex;
  complex_local = (Complex *)this;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::vertex_range
            ((Complex_vertex_range *)&local_48,complex);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin(__return_storage_ptr__,&local_48);
  pCVar1 = local_18;
  rVar3 = boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
          ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                       *)__return_storage_ptr__);
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  ::Simplex_around_vertex_iterator
            (&this->current_simplex_around_current_vertex_,pCVar1,(Vertex_handle)rVar3.vertex);
  pCVar1 = local_18;
  rVar3 = boost::iterators::detail::
          iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
          ::operator*((iterator_facade_base<Gudhi::skeleton_blocker::Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_boost::iterators::forward_traversal_tag,_const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_long,_false,_false>
                       *)__return_storage_ptr__);
  Simplex_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_superior<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  ::Simplex_around_vertex_iterator
            (&this->simplices_around_current_vertex_end_,pCVar1,(Vertex_handle)rVar3.vertex,true);
  bVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::empty
                    (local_18);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!complex->empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/iterators/Skeleton_blockers_simplices_iterators.h"
                  ,0xe5,
                  "Gudhi::skeleton_blocker::Simplex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>>::Simplex_iterator(const Complex *) [SkeletonBlockerComplex = Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>]"
                 );
  }
  return;
}

Assistant:

Simplex_iterator(const Complex* complex) :
      complex_(complex),
      current_vertex_(complex->vertex_range().begin()),
      current_simplex_around_current_vertex_(complex, *current_vertex_),
      simplices_around_current_vertex_end_(complex, *current_vertex_, true) {
    // should not be called if the complex is empty
    assert(!complex->empty());
  }